

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

uint32_t cfd::core::ConvertToExtkeyVersion
                   (NetType network_type,Bip32FormatType format_type,bool is_privkey)

{
  ExtkeyVersionPair EVar1;
  uint32_t local_bc;
  uint32_t local_98;
  uint32_t uStack_94;
  ExtkeyVersionPair versions;
  KeyFormatData format_data;
  bool is_privkey_local;
  Bip32FormatType format_type_local;
  NetType network_type_local;
  
  GetKeyFormatData((KeyFormatData *)&versions,network_type);
  EVar1 = KeyFormatData::GetVersionPair((KeyFormatData *)&versions,format_type);
  if (is_privkey) {
    uStack_94 = EVar1.privkey_version;
    local_bc = uStack_94;
  }
  else {
    local_98 = EVar1.pubkey_version;
    local_bc = local_98;
  }
  KeyFormatData::~KeyFormatData((KeyFormatData *)&versions);
  return local_bc;
}

Assistant:

static uint32_t ConvertToExtkeyVersion(
    NetType network_type, Bip32FormatType format_type, bool is_privkey) {
  auto format_data = GetKeyFormatData(network_type);
  auto versions = format_data.GetVersionPair(format_type);
  return (is_privkey) ? versions.privkey_version : versions.pubkey_version;
}